

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_types.h
# Opt level: O1

Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
* __thiscall
viras::
lcm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
          (Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
           *__return_storage_ptr__,viras *this,
          Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
          *l,Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
             *r)

{
  RealConstantType *pRVar1;
  RealConstantType *r_00;
  RealConstantType *r_01;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
  *pCVar2;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *x;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *x_00;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *x_01;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *x_02;
  RealConstantType local_280;
  RealConstantType local_260;
  Numeral local_240;
  RealConstantType local_220;
  RealConstantType local_200;
  Numeral local_1e0;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
  *local_1c0;
  RealConstantType local_1b8;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  local_198;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
  *local_170;
  RealConstantType local_168;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  local_148;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  local_120;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
  *local_f8;
  __mpz_struct local_f0;
  __mpz_struct local_e0;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  local_d0;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
  *local_a8;
  __mpz_struct local_a0;
  __mpz_struct local_90;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  local_80;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  local_58;
  
  pCVar2 = *(Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
             **)this;
  local_170 = pCVar2;
  Kernel::RealConstantType::RealConstantType(&local_168,(RealConstantType *)(this + 8));
  num<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
            (&local_148,(viras *)&local_170,x);
  Kernel::RealConstantType::RealConstantType
            (&local_200,
             &local_148.
              super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
              .inner);
  local_1c0 = (l->
              super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
              ).config;
  pRVar1 = &(l->
            super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
            ).inner;
  Kernel::RealConstantType::RealConstantType(&local_1b8,pRVar1);
  num<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
            (&local_198,(viras *)&local_1c0,x_00);
  Kernel::RealConstantType::RealConstantType
            (&local_220,
             &local_198.
              super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
              .inner);
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
  ::lcm(&local_1e0,pCVar2,&local_200,&local_220);
  local_120.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
  .config = *(Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
              **)this;
  Kernel::RealConstantType::RealConstantType
            (&local_120.
              super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
              .inner,&local_1e0);
  pCVar2 = *(Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
             **)this;
  local_a8 = pCVar2;
  Kernel::RealConstantType::RealConstantType
            ((RealConstantType *)&local_a0,(RealConstantType *)(this + 8));
  den<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
            (&local_80,(viras *)&local_a8,x_01);
  r_00 = &local_80.
          super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
          .inner;
  Kernel::RealConstantType::RealConstantType(&local_260,r_00);
  local_f8 = (l->
             super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
             ).config;
  Kernel::RealConstantType::RealConstantType((RealConstantType *)&local_f0,pRVar1);
  den<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
            (&local_d0,(viras *)&local_f8,x_02);
  pRVar1 = &local_d0.
            super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
            .inner;
  Kernel::RealConstantType::RealConstantType(&local_280,pRVar1);
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
  ::gcd(&local_240,pCVar2,&local_260,&local_280);
  local_58.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
  .config = *(Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
              **)this;
  r_01 = &local_58.
          super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
          .inner;
  Kernel::RealConstantType::RealConstantType(r_01,&local_240);
  sugar::operator/(__return_storage_ptr__,&local_120,&local_58);
  mpz_clear(local_58.
            super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
            .inner.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)r_01);
  mpz_clear(local_240.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)&local_240);
  mpz_clear(local_280.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)&local_280);
  mpz_clear(local_d0.
            super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
            .inner.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)pRVar1);
  mpz_clear(&local_e0);
  mpz_clear(&local_f0);
  mpz_clear(local_260.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)&local_260);
  mpz_clear(local_80.
            super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
            .inner.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)r_00);
  mpz_clear(&local_90);
  mpz_clear(&local_a0);
  mpz_clear(local_120.
            super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
            .inner.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)
            &local_120.
             super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
             .inner);
  mpz_clear(local_1e0.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)&local_1e0);
  mpz_clear(local_220.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)&local_220);
  mpz_clear(local_198.
            super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
            .inner.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)
            &local_198.
             super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
             .inner);
  mpz_clear(local_1b8.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)&local_1b8);
  mpz_clear(local_200.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)&local_200);
  mpz_clear(local_148.
            super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
            .inner.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)
            &local_148.
             super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
             .inner);
  mpz_clear(local_168.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)&local_168);
  return __return_storage_ptr__;
}

Assistant:

Numeral<C> lcm(Numeral<C> l, Numeral<C> r)
  { 
    auto cn = [&](auto x) { return Numeral<C> { l.config, x }; };
    return cn(l.config->lcm(num(l).inner, num(r).inner)) 
         / cn(l.config->gcd(den(l).inner, den(r).inner));  
  }